

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

bool __thiscall HEkkDual::dualInfoOk(HEkkDual *this,HighsLp *lp)

{
  uint uVar1;
  uint uVar2;
  uint *in_RSI;
  long in_RDI;
  bool bVar3;
  bool dimensions_ok;
  HighsInt lp_num_row;
  HighsInt lp_num_col;
  bool local_1;
  
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  bVar3 = false;
  if (uVar1 == *(uint *)(in_RDI + 0x1c)) {
    bVar3 = uVar2 == *(uint *)(in_RDI + 0x18);
  }
  if (bVar3) {
    bVar3 = false;
    if (uVar1 == *(uint *)**(undefined8 **)(in_RDI + 0x38)) {
      bVar3 = uVar2 == *(uint *)(**(long **)(in_RDI + 0x38) + 4);
    }
    if (bVar3) {
      local_1 = true;
    }
    else {
      highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kError,
                  "LP-Factor dimension incompatibility (%d, %d) != (%d, %d)\n",(ulong)uVar1,
                  (ulong)*(uint *)**(undefined8 **)(in_RDI + 0x38),(ulong)uVar2,
                  *(undefined4 *)(**(long **)(in_RDI + 0x38) + 4));
      local_1 = false;
    }
  }
  else {
    highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kError,
                "LP-Solver dimension incompatibility (%d, %d) != (%d, %d)\n",(ulong)uVar1,
                (ulong)*(uint *)(in_RDI + 0x1c),(ulong)uVar2,*(undefined4 *)(in_RDI + 0x18));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HEkkDual::dualInfoOk(const HighsLp& lp) {
  HighsInt lp_num_col = lp.num_col_;
  HighsInt lp_num_row = lp.num_row_;
  bool dimensions_ok;
  dimensions_ok = lp_num_col == solver_num_col && lp_num_row == solver_num_row;
  assert(dimensions_ok);
  if (!dimensions_ok) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                "LP-Solver dimension incompatibility (%" HIGHSINT_FORMAT
                ", %" HIGHSINT_FORMAT ") != (%" HIGHSINT_FORMAT
                ", %" HIGHSINT_FORMAT ")\n",
                lp_num_col, solver_num_col, lp_num_row, solver_num_row);
    return false;
  }
  dimensions_ok = lp_num_col == simplex_nla->lp_->num_col_ &&
                  lp_num_row == simplex_nla->lp_->num_row_;
  assert(dimensions_ok);
  if (!dimensions_ok) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                "LP-Factor dimension incompatibility (%" HIGHSINT_FORMAT
                ", %" HIGHSINT_FORMAT ") != (%" HIGHSINT_FORMAT
                ", %" HIGHSINT_FORMAT ")\n",
                lp_num_col, simplex_nla->lp_->num_col_, lp_num_row,
                simplex_nla->lp_->num_row_);
    return false;
  }
  return true;
}